

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_strategy.h
# Opt level: O0

void __thiscall
charls::encoder_strategy::append_to_bit_stream
          (encoder_strategy *this,uint32_t bits,int32_t bit_count)

{
  bool bVar1;
  uint32_t uVar2;
  uint uVar3;
  pointer this_00;
  bool bVar4;
  bool local_1d;
  uint32_t mask;
  int32_t bit_count_local;
  uint32_t bits_local;
  encoder_strategy *this_local;
  
  local_1d = 0x1f < (uint)bit_count;
  if (local_1d) {
    __assert_fail("bit_count < 32 && bit_count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/encoder_strategy.h"
                  ,0x30,
                  "void charls::encoder_strategy::append_to_bit_stream(const uint32_t, const int32_t)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->decoder_);
  bVar4 = true;
  if ((bVar1) && ((bit_count != 0 || (bVar4 = true, bits != 0)))) {
    this_00 = std::
              unique_ptr<charls::decoder_strategy,_std::default_delete<charls::decoder_strategy>_>::
              operator->(&this->decoder_);
    uVar2 = decoder_strategy::read_long_value(this_00,bit_count);
    bVar4 = uVar2 == bits;
  }
  if (!bVar4) {
    __assert_fail("(!decoder_) || (bit_count == 0 && bits == 0) || (static_cast<uint32_t>(decoder_->read_long_value(bit_count)) == bits)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/encoder_strategy.h"
                  ,0x32,
                  "void charls::encoder_strategy::append_to_bit_stream(const uint32_t, const int32_t)"
                 );
  }
  uVar3 = (1 << ((byte)bit_count & 0x1f)) - 1;
  if ((bits | uVar3) != uVar3) {
    __assert_fail("(bits | mask) == mask",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/encoder_strategy.h"
                  ,0x35,
                  "void charls::encoder_strategy::append_to_bit_stream(const uint32_t, const int32_t)"
                 );
  }
  this->free_bit_count_ = this->free_bit_count_ - bit_count;
  if (this->free_bit_count_ < 0) {
    this->bit_buffer_ = bits >> (-(char)this->free_bit_count_ & 0x1fU) | this->bit_buffer_;
    flush(this);
    if (this->free_bit_count_ < 0) {
      this->bit_buffer_ = bits >> (-(char)this->free_bit_count_ & 0x1fU) | this->bit_buffer_;
      flush(this);
    }
    if (this->free_bit_count_ < 0) {
      __assert_fail("free_bit_count_ >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/encoder_strategy.h"
                    ,0x4a,
                    "void charls::encoder_strategy::append_to_bit_stream(const uint32_t, const int32_t)"
                   );
    }
    this->bit_buffer_ = bits << ((byte)this->free_bit_count_ & 0x1f) | this->bit_buffer_;
  }
  else {
    this->bit_buffer_ = bits << ((byte)this->free_bit_count_ & 0x1f) | this->bit_buffer_;
  }
  return;
}

Assistant:

void append_to_bit_stream(const uint32_t bits, const int32_t bit_count)
    {
        ASSERT(bit_count < 32 && bit_count >= 0);
        ASSERT((!decoder_) || (bit_count == 0 && bits == 0) ||
               (static_cast<uint32_t>(decoder_->read_long_value(bit_count)) == bits));
#ifndef NDEBUG
        const uint32_t mask{(1U << bit_count) - 1U};
        ASSERT((bits | mask) == mask); // Not used bits must be set to zero.
#endif

        free_bit_count_ -= bit_count;
        if (free_bit_count_ >= 0)
        {
            bit_buffer_ |= bits << free_bit_count_;
        }
        else
        {
            // Add as much bits in the remaining space as possible and flush.
            bit_buffer_ |= bits >> -free_bit_count_;
            flush();

            // A second flush may be required if extra marker detect bits were needed and not all bits could be written.
            if (free_bit_count_ < 0)
            {
                bit_buffer_ |= bits >> -free_bit_count_;
                flush();
            }

            ASSERT(free_bit_count_ >= 0);
            bit_buffer_ |= bits << free_bit_count_;
        }
    }